

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O0

int FixedDiv1_X86(int num,int div)

{
  int div_local;
  int num_local;
  
  return (int)(CONCAT44(((num >> 0x1f) << 0x10 | (uint)num >> 0x10) -
                        (uint)((uint)(num * 0x10000) < 0x10001),num * 0x10000 - 0x10001) /
              (long)(div + -1));
}

Assistant:

int FixedDiv1_X86(int num, int div) {
  asm volatile(
      "cdq                                       \n"
      "shld        $0x10,%%eax,%%edx             \n"
      "shl         $0x10,%%eax                   \n"
      "sub         $0x10001,%%eax                \n"
      "sbb         $0x0,%%edx                    \n"
      "sub         $0x1,%1                       \n"
      "idiv        %1                            \n"
      "mov         %0, %%eax                     \n"
      : "+a"(num)  // %0
      : "c"(div)   // %1
      : "memory", "cc", "edx");
  return num;
}